

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

int NCONF_load(CONF *conf,char *file,long *eline)

{
  BIO *a;
  int ret;
  BIO *in;
  long *out_error_line_local;
  char *filename_local;
  CONF *conf_local;
  
  a = BIO_new_file(file,"rb");
  if (a == (BIO *)0x0) {
    ERR_put_error(0xd,0,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0x237);
    conf_local._4_4_ = 0;
  }
  else {
    conf_local._4_4_ = NCONF_load_bio((CONF *)conf,(BIO *)a,eline);
    BIO_free(a);
  }
  return conf_local._4_4_;
}

Assistant:

int NCONF_load(CONF *conf, const char *filename, long *out_error_line) {
  BIO *in = BIO_new_file(filename, "rb");
  int ret;

  if (in == NULL) {
    OPENSSL_PUT_ERROR(CONF, ERR_R_SYS_LIB);
    return 0;
  }

  ret = NCONF_load_bio(conf, in, out_error_line);
  BIO_free(in);

  return ret;
}